

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O2

void * deAlignedRealloc(void *ptr,size_t numBytes,size_t alignBytes)

{
  ulong uVar1;
  void *pvVar2;
  
  if (ptr == (void *)0x0) {
    pvVar2 = deAlignedMalloc(numBytes,alignBytes);
    return pvVar2;
  }
  if (numBytes == 0) {
    free(ptr);
  }
  else {
    uVar1 = malloc_usable_size(ptr);
    if (numBytes <= uVar1 && uVar1 <= numBytes * 2) {
      return ptr;
    }
    pvVar2 = deAlignedMalloc(numBytes,alignBytes);
    if (pvVar2 != (void *)0x0) {
      if (uVar1 < numBytes) {
        numBytes = uVar1;
      }
      memcpy(pvVar2,ptr,numBytes);
      free(ptr);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void* deAlignedRealloc (void* ptr, size_t numBytes, size_t alignBytes)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	return _aligned_realloc(ptr, numBytes, alignBytes);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC) || (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	if (ptr)
	{
		if (numBytes > 0)
		{
#	if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
			const size_t				oldSize	= getAlignedAllocHeader(ptr)->numBytes;
#	else /* DE_ALIGNED_MALLOC_GENERIC */
			const size_t				oldSize	= malloc_usable_size(ptr);
#	endif

			DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));

			if (oldSize < numBytes || oldSize > numBytes*2)
			{
				/* Create a new alloc if original is smaller, or more than twice the requested size */
				void* const	newPtr	= deAlignedMalloc(numBytes, alignBytes);

				if (newPtr)
				{
					const size_t	copyBytes	= numBytes < oldSize ? numBytes : oldSize;

					deMemcpy(newPtr, ptr, copyBytes);
					deAlignedFree(ptr);

					return newPtr;
				}
				else
					return DE_NULL;
			}
			else
				return ptr;
		}
		else
		{
			deAlignedFree(ptr);
			return DE_NULL;
		}
	}
	else
		return deAlignedMalloc(numBytes, alignBytes);

#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}